

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_frommesh.cpp
# Opt level: O0

ON_NgonBoundaryComponent * __thiscall
ON_NgonBoundaryChecker::Internal_AddEdge
          (ON_NgonBoundaryChecker *this,uint vertex_index0,uint vertex_index1,bool bMustBeOriented)

{
  uint uVar1;
  ON_NgonBoundaryComponent *pOVar2;
  ON_NgonBoundaryComponent *pOVar3;
  ON_NgonBoundaryComponent *local_48;
  ON_NgonBoundaryComponent *e;
  uint hash_index;
  ON_NgonBoundaryComponent *v [2];
  bool bMustBeOriented_local;
  uint vertex_index1_local;
  uint vertex_index0_local;
  ON_NgonBoundaryChecker *this_local;
  
  if ((this->m_bIsNotSimple & 1U) == 0) {
    if (vertex_index0 == vertex_index1) {
      Internal_ReturnIsNotSimple(this);
      this_local = (ON_NgonBoundaryChecker *)0x0;
    }
    else {
      pOVar2 = Internal_AddVertex(this,vertex_index0);
      pOVar3 = Internal_AddVertex(this,vertex_index1);
      if ((pOVar2 == (ON_NgonBoundaryComponent *)0x0) || (pOVar3 == (ON_NgonBoundaryComponent *)0x0)
         ) {
        Internal_ReturnIsNotSimple(this);
        this_local = (ON_NgonBoundaryChecker *)0x0;
      }
      else {
        uVar1 = Internal_EdgeHashIndex(vertex_index0,vertex_index1);
        for (local_48 = this->m_hash_table[uVar1]; local_48 != (ON_NgonBoundaryComponent *)0x0;
            local_48 = local_48->m_next) {
          if ((local_48->m_type == Edge) &&
             (((local_48->m_attached_to[0] == pOVar2 && (local_48->m_attached_to[1] == pOVar3)) ||
              ((local_48->m_attached_to[0] == pOVar3 && (local_48->m_attached_to[1] == pOVar2))))))
          {
            if (local_48->m_face_count != '\x01') {
              Internal_ReturnIsNotSimple(this);
              return (ON_NgonBoundaryComponent *)0x0;
            }
            if ((bMustBeOriented) &&
               ((local_48->m_attached_to[0] != pOVar3 || (local_48->m_attached_to[1] != pOVar2)))) {
              Internal_ReturnIsNotSimple(this);
              return (ON_NgonBoundaryComponent *)0x0;
            }
            local_48->m_face_count = '\x02';
            return local_48;
          }
        }
        this_local = (ON_NgonBoundaryChecker *)ON_FixedSizePool::AllocateElement(&this->m_fsp);
        *(Type *)&(this_local->m_fsp).m_first_block = Edge;
        *(uchar *)((long)&(this_local->m_fsp).m_first_block + 2) = '\x01';
        *(uchar *)((long)&(this_local->m_fsp).m_first_block + 3) = '\x02';
        (this_local->m_fsp).m_al_element_stack = pOVar2;
        (this_local->m_fsp).m_al_block = pOVar3;
        (this_local->m_fsp).m_al_element_array = this->m_hash_table[uVar1];
        this->m_hash_table[uVar1] = (ON_NgonBoundaryComponent *)this_local;
        this->m_edge_count = this->m_edge_count + 1;
      }
    }
  }
  else {
    this_local = (ON_NgonBoundaryChecker *)0x0;
  }
  return (ON_NgonBoundaryComponent *)this_local;
}

Assistant:

ON_NgonBoundaryComponent* ON_NgonBoundaryChecker::Internal_AddEdge(unsigned int vertex_index0, unsigned int vertex_index1, bool bMustBeOriented)
{
  if (m_bIsNotSimple)
    return nullptr;

  if (vertex_index0 == vertex_index1)
  {
    Internal_ReturnIsNotSimple();
    return nullptr;
  }

  ON_NgonBoundaryComponent* v[2] = { Internal_AddVertex(vertex_index0), Internal_AddVertex(vertex_index1) };
  if (nullptr == v[0] || nullptr == v[1])
  {
    Internal_ReturnIsNotSimple();
    return nullptr;
  }

  const unsigned hash_index = ON_NgonBoundaryChecker::Internal_EdgeHashIndex(vertex_index0, vertex_index1);
  ON_NgonBoundaryComponent* e;
  for (
    e = m_hash_table[hash_index];
    nullptr != e;
    e = e->m_next
    )
  {
    if (
      ON_NgonBoundaryComponent::Type::Edge == e->m_type
      &&
      ((e->m_attached_to[0] == v[0] && e->m_attached_to[1] == v[1]) || (e->m_attached_to[0] == v[1] && e->m_attached_to[1] == v[0]))
      )
    {
      if (1 == e->m_face_count)
      {
        if (bMustBeOriented)
        {
          if (e->m_attached_to[0] != v[1] || e->m_attached_to[1] != v[0])
          {
            // The 2 faces attached to this edge are not compatibly oriented.
            Internal_ReturnIsNotSimple();
            return nullptr;
          }
        }
        // this is an interior edge
        e->m_face_count = 2;
        return e;
      }
      // nonmanifold edge
      Internal_ReturnIsNotSimple();
      return nullptr;
    }
  }

  e = (ON_NgonBoundaryComponent*)m_fsp.AllocateElement();
  e->m_type = ON_NgonBoundaryComponent::Type::Edge;
  e->m_face_count = 1;
  e->m_attached_count = 2;
  e->m_attached_to[0] = v[0];
  e->m_attached_to[1] = v[1];
  e->m_next = m_hash_table[hash_index];
  m_hash_table[hash_index] = e;
  ++m_edge_count;
  return e;
}